

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

int __thiscall
sznet::net::Socket::accept(Socket *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  sz_sock sVar1;
  uint32_t in_register_00000034;
  undefined1 local_34 [4];
  sz_sock connfd;
  sockaddr_in6 addr;
  InetAddress *peeraddr_local;
  Socket *this_local;
  
  addr.sin6_scope_id = in_register_00000034;
  addr.sin6_addr.__in6_u.__u6_addr32[3] = __fd;
  memset(local_34,0,0x1c);
  sVar1 = sockets::sz_accept(this->m_sockfd,(sockaddr_in6 *)local_34);
  if (-1 < sVar1) {
    InetAddress::setSockAddrInet6((InetAddress *)addr._20_8_,(sockaddr_in6 *)local_34);
  }
  return sVar1;
}

Assistant:

sockets::sz_sock Socket::accept(InetAddress* peeraddr)
{
	struct sockaddr_in6 addr;
	memset(&addr, 0, sizeof(addr));
	sockets::sz_sock connfd = sockets::sz_accept(m_sockfd, &addr);
	if (connfd >= 0)
	{
		peeraddr->setSockAddrInet6(addr);
	}
	return connfd;
}